

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureCompletenessTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Functional::TextureCompletenessTests::init
          (TextureCompletenessTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  TestContext *pTVar2;
  TestContext *pTVar3;
  ContextInfo *pCVar4;
  int extraout_EAX;
  TestNode *pTVar5;
  TestNode *node;
  Incomplete2DSizeCase *pIVar6;
  TestNode *pTVar7;
  IncompleteCubeSizeCase *pIVar8;
  IVec2 local_c0;
  IVec2 local_b8;
  IVec2 local_b0;
  IVec2 local_a8;
  IVec2 local_a0;
  IVec2 local_98;
  IVec2 local_90;
  IVec2 local_88;
  IVec2 local_80;
  IVec2 local_78;
  IVec2 local_70;
  IVec2 local_68;
  IVec2 local_60;
  IVec2 local_58;
  IVec2 local_50;
  IVec2 local_48;
  IVec2 local_40;
  IVec2 local_38;
  
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"2d",
             "2D completeness");
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"cube",
             "Cubemap completeness");
  tcu::TestNode::addChild((TestNode *)this,node);
  pIVar6 = (Incomplete2DSizeCase *)operator_new(0xa0);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  local_38.m_data[0] = 0xff;
  local_38.m_data[1] = 0xff;
  local_40.m_data[0] = 0xff;
  local_40.m_data[1] = 0xff;
  Incomplete2DSizeCase::Incomplete2DSizeCase
            (pIVar6,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             pCVar1->m_renderCtx,"npot_size","",&local_38,&local_40,0,pCVar1->m_contextInfo);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pIVar6);
  pIVar6 = (Incomplete2DSizeCase *)operator_new(0xa0);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  local_48.m_data[0] = 0x100;
  local_48.m_data[1] = 0x100;
  local_50.m_data[0] = 0xff;
  local_50.m_data[1] = 0xff;
  Incomplete2DSizeCase::Incomplete2DSizeCase
            (pIVar6,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             pCVar1->m_renderCtx,"npot_size_level_0","",&local_48,&local_50,0,pCVar1->m_contextInfo)
  ;
  tcu::TestNode::addChild(pTVar5,(TestNode *)pIVar6);
  pIVar6 = (Incomplete2DSizeCase *)operator_new(0xa0);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  local_58.m_data[0] = 0x100;
  local_58.m_data[1] = 0x100;
  local_60.m_data[0] = 0x7f;
  local_60.m_data[1] = 0x7f;
  Incomplete2DSizeCase::Incomplete2DSizeCase
            (pIVar6,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             pCVar1->m_renderCtx,"npot_size_level_1","",&local_58,&local_60,1,pCVar1->m_contextInfo)
  ;
  tcu::TestNode::addChild(pTVar5,(TestNode *)pIVar6);
  pIVar6 = (Incomplete2DSizeCase *)operator_new(0xa0);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  local_68.m_data[0] = 0x100;
  local_68.m_data[1] = 0x100;
  local_70.m_data[0] = 0;
  local_70.m_data[1] = 0;
  Incomplete2DSizeCase::Incomplete2DSizeCase
            (pIVar6,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             pCVar1->m_renderCtx,"not_positive_level_0","",&local_68,&local_70,0,
             pCVar1->m_contextInfo);
  tcu::TestNode::addChild(pTVar5,(TestNode *)pIVar6);
  pTVar7 = (TestNode *)operator_new(0x98);
  pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pTVar3 = (TestContext *)((this->super_TestCaseGroup).m_context)->m_renderCtx;
  tcu::TestCase::TestCase((TestCase *)pTVar7,pTVar2,"format_mismatch_rgb_rgba","");
  pTVar7[1]._vptr_TestNode = (_func_int **)pTVar2;
  pTVar7[1].m_testCtx = pTVar3;
  *(undefined4 *)&pTVar7[1].m_name._M_dataplus._M_p = 0xff000000;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_0078c390;
  *(undefined8 *)((long)&pTVar7[1].m_name._M_dataplus._M_p + 4) = 0x190700000001;
  *(undefined8 *)((long)&pTVar7[1].m_name._M_string_length + 4) = 0x8000001908;
  *(undefined4 *)((long)&pTVar7[1].m_name.field_2 + 4) = 0x80;
  tcu::TestNode::addChild(pTVar5,pTVar7);
  pTVar7 = (TestNode *)operator_new(0x98);
  pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pTVar3 = (TestContext *)((this->super_TestCaseGroup).m_context)->m_renderCtx;
  tcu::TestCase::TestCase((TestCase *)pTVar7,pTVar2,"format_mismatch_rgba_rgb","");
  pTVar7[1]._vptr_TestNode = (_func_int **)pTVar2;
  pTVar7[1].m_testCtx = pTVar3;
  *(undefined4 *)&pTVar7[1].m_name._M_dataplus._M_p = 0xff000000;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_0078c390;
  *(undefined8 *)((long)&pTVar7[1].m_name._M_dataplus._M_p + 4) = 0x190800000001;
  *(undefined8 *)((long)&pTVar7[1].m_name._M_string_length + 4) = 0x8000001907;
  *(undefined4 *)((long)&pTVar7[1].m_name.field_2 + 4) = 0x80;
  tcu::TestNode::addChild(pTVar5,pTVar7);
  pTVar7 = (TestNode *)operator_new(0x98);
  pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pTVar3 = (TestContext *)((this->super_TestCaseGroup).m_context)->m_renderCtx;
  tcu::TestCase::TestCase((TestCase *)pTVar7,pTVar2,"format_mismatch_luminance_luminance_alpha","");
  pTVar7[1]._vptr_TestNode = (_func_int **)pTVar2;
  pTVar7[1].m_testCtx = pTVar3;
  *(undefined4 *)&pTVar7[1].m_name._M_dataplus._M_p = 0xff000000;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_0078c390;
  *(undefined8 *)((long)&pTVar7[1].m_name._M_dataplus._M_p + 4) = 0x190900000001;
  *(undefined8 *)((long)&pTVar7[1].m_name._M_string_length + 4) = 0x800000190a;
  *(undefined4 *)((long)&pTVar7[1].m_name.field_2 + 4) = 0x80;
  tcu::TestNode::addChild(pTVar5,pTVar7);
  pTVar7 = (TestNode *)operator_new(0x98);
  pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pTVar3 = (TestContext *)((this->super_TestCaseGroup).m_context)->m_renderCtx;
  tcu::TestCase::TestCase((TestCase *)pTVar7,pTVar2,"format_mismatch_luminance_alpha_luminance","");
  pTVar7[1]._vptr_TestNode = (_func_int **)pTVar2;
  pTVar7[1].m_testCtx = pTVar3;
  *(undefined4 *)&pTVar7[1].m_name._M_dataplus._M_p = 0xff000000;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_0078c390;
  *(undefined8 *)((long)&pTVar7[1].m_name._M_dataplus._M_p + 4) = 0x190a00000001;
  *(undefined8 *)((long)&pTVar7[1].m_name._M_string_length + 4) = 0x8000001909;
  *(undefined4 *)((long)&pTVar7[1].m_name.field_2 + 4) = 0x80;
  tcu::TestNode::addChild(pTVar5,pTVar7);
  pTVar7 = (TestNode *)operator_new(0x90);
  pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pTVar3 = (TestContext *)((this->super_TestCaseGroup).m_context)->m_renderCtx;
  tcu::TestCase::TestCase((TestCase *)pTVar7,pTVar2,"missing_level_1","");
  pTVar7[1]._vptr_TestNode = (_func_int **)pTVar2;
  pTVar7[1].m_testCtx = pTVar3;
  *(undefined4 *)&pTVar7[1].m_name._M_dataplus._M_p = 0xff000000;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_0078c3d0;
  *(undefined8 *)((long)&pTVar7[1].m_name._M_dataplus._M_p + 4) = 0x8000000001;
  *(undefined4 *)((long)&pTVar7[1].m_name._M_string_length + 4) = 0x80;
  tcu::TestNode::addChild(pTVar5,pTVar7);
  pTVar7 = (TestNode *)operator_new(0x90);
  pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pTVar3 = (TestContext *)((this->super_TestCaseGroup).m_context)->m_renderCtx;
  tcu::TestCase::TestCase((TestCase *)pTVar7,pTVar2,"missing_level_3","");
  pTVar7[1]._vptr_TestNode = (_func_int **)pTVar2;
  pTVar7[1].m_testCtx = pTVar3;
  *(undefined4 *)&pTVar7[1].m_name._M_dataplus._M_p = 0xff000000;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_0078c3d0;
  *(undefined8 *)((long)&pTVar7[1].m_name._M_dataplus._M_p + 4) = 0x8000000003;
  *(undefined4 *)((long)&pTVar7[1].m_name._M_string_length + 4) = 0x80;
  tcu::TestNode::addChild(pTVar5,pTVar7);
  pTVar7 = (TestNode *)operator_new(0x90);
  pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pTVar3 = (TestContext *)((this->super_TestCaseGroup).m_context)->m_renderCtx;
  tcu::TestCase::TestCase((TestCase *)pTVar7,pTVar2,"last_level_missing","");
  pTVar7[1]._vptr_TestNode = (_func_int **)pTVar2;
  pTVar7[1].m_testCtx = pTVar3;
  *(undefined4 *)&pTVar7[1].m_name._M_dataplus._M_p = 0xff000000;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_0078c3d0;
  *(undefined8 *)((long)&pTVar7[1].m_name._M_dataplus._M_p + 4) = 0x8000000007;
  *(undefined4 *)((long)&pTVar7[1].m_name._M_string_length + 4) = 0x40;
  tcu::TestNode::addChild(pTVar5,pTVar7);
  pTVar7 = (TestNode *)operator_new(0xa0);
  pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pCVar1 = (this->super_TestCaseGroup).m_context;
  pTVar3 = (TestContext *)pCVar1->m_renderCtx;
  pCVar4 = pCVar1->m_contextInfo;
  tcu::TestCase::TestCase((TestCase *)pTVar7,pTVar2,"npot_t_repeat","");
  pTVar7[1]._vptr_TestNode = (_func_int **)pTVar2;
  pTVar7[1].m_testCtx = pTVar3;
  *(undefined4 *)&pTVar7[1].m_name._M_dataplus._M_p = 0xff000000;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_0078c410;
  *(undefined8 *)((long)&pTVar7[1].m_name._M_dataplus._M_p + 4) = 0x29010000812f;
  pTVar7[1].m_name.field_2._M_allocated_capacity = (size_type)pCVar4;
  *(undefined8 *)((long)&pTVar7[1].m_name.field_2 + 8) = 0x7f0000007f;
  tcu::TestNode::addChild(pTVar5,pTVar7);
  pTVar7 = (TestNode *)operator_new(0xa0);
  pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pCVar1 = (this->super_TestCaseGroup).m_context;
  pTVar3 = (TestContext *)pCVar1->m_renderCtx;
  pCVar4 = pCVar1->m_contextInfo;
  tcu::TestCase::TestCase((TestCase *)pTVar7,pTVar2,"npot_s_repeat","");
  pTVar7[1]._vptr_TestNode = (_func_int **)pTVar2;
  pTVar7[1].m_testCtx = pTVar3;
  *(undefined4 *)&pTVar7[1].m_name._M_dataplus._M_p = 0xff000000;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_0078c410;
  *(undefined8 *)((long)&pTVar7[1].m_name._M_dataplus._M_p + 4) = 0x812f00002901;
  pTVar7[1].m_name.field_2._M_allocated_capacity = (size_type)pCVar4;
  *(undefined8 *)((long)&pTVar7[1].m_name.field_2 + 8) = 0x7f0000007f;
  tcu::TestNode::addChild(pTVar5,pTVar7);
  pTVar7 = (TestNode *)operator_new(0xa0);
  pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pCVar1 = (this->super_TestCaseGroup).m_context;
  pTVar3 = (TestContext *)pCVar1->m_renderCtx;
  pCVar4 = pCVar1->m_contextInfo;
  tcu::TestCase::TestCase((TestCase *)pTVar7,pTVar2,"npot_all_repeat","");
  pTVar7[1]._vptr_TestNode = (_func_int **)pTVar2;
  pTVar7[1].m_testCtx = pTVar3;
  *(undefined4 *)&pTVar7[1].m_name._M_dataplus._M_p = 0xff000000;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_0078c410;
  *(undefined8 *)((long)&pTVar7[1].m_name._M_dataplus._M_p + 4) = 0x290100002901;
  pTVar7[1].m_name.field_2._M_allocated_capacity = (size_type)pCVar4;
  *(undefined8 *)((long)&pTVar7[1].m_name.field_2 + 8) = 0x7f0000007f;
  tcu::TestNode::addChild(pTVar5,pTVar7);
  pTVar7 = (TestNode *)operator_new(0xa0);
  pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pCVar1 = (this->super_TestCaseGroup).m_context;
  pTVar3 = (TestContext *)pCVar1->m_renderCtx;
  pCVar4 = pCVar1->m_contextInfo;
  tcu::TestCase::TestCase((TestCase *)pTVar7,pTVar2,"npot_mirrored_repeat","");
  pTVar7[1]._vptr_TestNode = (_func_int **)pTVar2;
  pTVar7[1].m_testCtx = pTVar3;
  *(undefined4 *)&pTVar7[1].m_name._M_dataplus._M_p = 0xff000000;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_0078c410;
  *(undefined8 *)((long)&pTVar7[1].m_name._M_dataplus._M_p + 4) = 0x837000008370;
  pTVar7[1].m_name.field_2._M_allocated_capacity = (size_type)pCVar4;
  *(undefined8 *)((long)&pTVar7[1].m_name.field_2 + 8) = 0x7f0000007f;
  tcu::TestNode::addChild(pTVar5,pTVar7);
  pTVar7 = (TestNode *)operator_new(0xa0);
  pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pCVar1 = (this->super_TestCaseGroup).m_context;
  pTVar3 = (TestContext *)pCVar1->m_renderCtx;
  pCVar4 = pCVar1->m_contextInfo;
  tcu::TestCase::TestCase((TestCase *)pTVar7,pTVar2,"repeat_width_npot","");
  pTVar7[1]._vptr_TestNode = (_func_int **)pTVar2;
  pTVar7[1].m_testCtx = pTVar3;
  *(undefined4 *)&pTVar7[1].m_name._M_dataplus._M_p = 0xff000000;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_0078c410;
  *(undefined8 *)((long)&pTVar7[1].m_name._M_dataplus._M_p + 4) = 0x290100002901;
  pTVar7[1].m_name.field_2._M_allocated_capacity = (size_type)pCVar4;
  *(undefined8 *)((long)&pTVar7[1].m_name.field_2 + 8) = 0x800000007f;
  tcu::TestNode::addChild(pTVar5,pTVar7);
  pTVar7 = (TestNode *)operator_new(0xa0);
  pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pCVar1 = (this->super_TestCaseGroup).m_context;
  pTVar3 = (TestContext *)pCVar1->m_renderCtx;
  pCVar4 = pCVar1->m_contextInfo;
  tcu::TestCase::TestCase((TestCase *)pTVar7,pTVar2,"repeat_height_npot","");
  pTVar7[1]._vptr_TestNode = (_func_int **)pTVar2;
  pTVar7[1].m_testCtx = pTVar3;
  *(undefined4 *)&pTVar7[1].m_name._M_dataplus._M_p = 0xff000000;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_0078c410;
  *(undefined8 *)((long)&pTVar7[1].m_name._M_dataplus._M_p + 4) = 0x290100002901;
  pTVar7[1].m_name.field_2._M_allocated_capacity = (size_type)pCVar4;
  *(undefined8 *)((long)&pTVar7[1].m_name.field_2 + 8) = 0x7f00000080;
  tcu::TestNode::addChild(pTVar5,pTVar7);
  pTVar7 = (TestNode *)operator_new(0x90);
  pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pTVar3 = (TestContext *)((this->super_TestCaseGroup).m_context)->m_renderCtx;
  tcu::TestCase::TestCase((TestCase *)pTVar7,pTVar2,"extra_level","");
  pTVar7[1]._vptr_TestNode = (_func_int **)pTVar2;
  pTVar7[1].m_testCtx = pTVar3;
  *(undefined4 *)&pTVar7[1].m_name._M_dataplus._M_p = 0xff000000;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_0078c450;
  *(undefined8 *)((long)&pTVar7[1].m_name._M_dataplus._M_p + 4) = 0x4000000040;
  tcu::TestNode::addChild(pTVar5,pTVar7);
  pTVar7 = (TestNode *)operator_new(0x90);
  pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pTVar3 = (TestContext *)((this->super_TestCaseGroup).m_context)->m_renderCtx;
  tcu::TestCase::TestCase((TestCase *)pTVar7,pTVar2,"empty_object","");
  pTVar7[1]._vptr_TestNode = (_func_int **)pTVar2;
  pTVar7[1].m_testCtx = pTVar3;
  *(undefined4 *)&pTVar7[1].m_name._M_dataplus._M_p = 0xff000000;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_0078c490;
  *(undefined8 *)((long)&pTVar7[1].m_name._M_dataplus._M_p + 4) = 0x4000000040;
  tcu::TestNode::addChild(pTVar5,pTVar7);
  pIVar8 = (IncompleteCubeSizeCase *)operator_new(0xa0);
  local_78.m_data[0] = 0x40;
  local_78.m_data[1] = 0x40;
  local_80.m_data[0] = 0x3f;
  local_80.m_data[1] = 0x3f;
  IncompleteCubeSizeCase::IncompleteCubeSizeCase
            (pIVar8,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             ((this->super_TestCaseGroup).m_context)->m_renderCtx,"npot_size_level_0","",&local_78,
             &local_80,0);
  tcu::TestNode::addChild(node,(TestNode *)pIVar8);
  pIVar8 = (IncompleteCubeSizeCase *)operator_new(0xa0);
  local_88.m_data[0] = 0x40;
  local_88.m_data[1] = 0x40;
  local_90.m_data[0] = 0x1f;
  local_90.m_data[1] = 0x1f;
  IncompleteCubeSizeCase::IncompleteCubeSizeCase
            (pIVar8,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             ((this->super_TestCaseGroup).m_context)->m_renderCtx,"npot_size_level_1","",&local_88,
             &local_90,1);
  tcu::TestNode::addChild(node,(TestNode *)pIVar8);
  pIVar8 = (IncompleteCubeSizeCase *)operator_new(0xa0);
  local_98.m_data[0] = 0x40;
  local_98.m_data[1] = 0x40;
  local_a0.m_data[0] = 0x3f;
  local_a0.m_data[1] = 0x3f;
  IncompleteCubeSizeCase::IncompleteCubeSizeCase
            (pIVar8,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             ((this->super_TestCaseGroup).m_context)->m_renderCtx,"npot_size_level_0_pos_x","",
             &local_98,&local_a0,0,CUBEFACE_POSITIVE_X);
  tcu::TestNode::addChild(node,(TestNode *)pIVar8);
  pIVar8 = (IncompleteCubeSizeCase *)operator_new(0xa0);
  local_a8.m_data[0] = 0x40;
  local_a8.m_data[1] = 0x40;
  local_b0.m_data[0] = 0x1f;
  local_b0.m_data[1] = 0x1f;
  IncompleteCubeSizeCase::IncompleteCubeSizeCase
            (pIVar8,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             ((this->super_TestCaseGroup).m_context)->m_renderCtx,"npot_size_level_1_neg_x","",
             &local_a8,&local_b0,1,CUBEFACE_NEGATIVE_X);
  tcu::TestNode::addChild(node,(TestNode *)pIVar8);
  pIVar8 = (IncompleteCubeSizeCase *)operator_new(0xa0);
  local_b8.m_data[0] = 0x40;
  local_b8.m_data[1] = 0x40;
  local_c0.m_data[0] = 0;
  local_c0.m_data[1] = 0;
  IncompleteCubeSizeCase::IncompleteCubeSizeCase
            (pIVar8,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             ((this->super_TestCaseGroup).m_context)->m_renderCtx,"not_positive_level_0","",
             &local_b8,&local_c0,0);
  tcu::TestNode::addChild(node,(TestNode *)pIVar8);
  pTVar5 = (TestNode *)operator_new(0x98);
  pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pTVar3 = (TestContext *)((this->super_TestCaseGroup).m_context)->m_renderCtx;
  tcu::TestCase::TestCase((TestCase *)pTVar5,pTVar2,"format_mismatch_rgb_rgba_level_0","");
  pTVar5[1]._vptr_TestNode = (_func_int **)pTVar2;
  pTVar5[1].m_testCtx = pTVar3;
  *(undefined4 *)&pTVar5[1].m_name._M_dataplus._M_p = 0xff000000;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_0078c510;
  *(undefined8 *)((long)&pTVar5[1].m_name._M_dataplus._M_p + 4) = 0x190800001907;
  *(undefined8 *)((long)&pTVar5[1].m_name._M_string_length + 4) = 0x4000000006;
  *(undefined4 *)((long)&pTVar5[1].m_name.field_2 + 4) = 0x40;
  tcu::TestNode::addChild(node,pTVar5);
  pTVar5 = (TestNode *)operator_new(0x98);
  pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pTVar3 = (TestContext *)((this->super_TestCaseGroup).m_context)->m_renderCtx;
  tcu::TestCase::TestCase((TestCase *)pTVar5,pTVar2,"format_mismatch_rgba_rgb_level_0","");
  pTVar5[1]._vptr_TestNode = (_func_int **)pTVar2;
  pTVar5[1].m_testCtx = pTVar3;
  *(undefined4 *)&pTVar5[1].m_name._M_dataplus._M_p = 0xff000000;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_0078c510;
  *(undefined8 *)((long)&pTVar5[1].m_name._M_dataplus._M_p + 4) = 0x190700001908;
  *(undefined8 *)((long)&pTVar5[1].m_name._M_string_length + 4) = 0x4000000006;
  *(undefined4 *)((long)&pTVar5[1].m_name.field_2 + 4) = 0x40;
  tcu::TestNode::addChild(node,pTVar5);
  pTVar5 = (TestNode *)operator_new(0x98);
  pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pTVar3 = (TestContext *)((this->super_TestCaseGroup).m_context)->m_renderCtx;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar5,pTVar2,"format_mismatch_luminance_luminance_alpha_level_0","");
  pTVar5[1]._vptr_TestNode = (_func_int **)pTVar2;
  pTVar5[1].m_testCtx = pTVar3;
  *(undefined4 *)&pTVar5[1].m_name._M_dataplus._M_p = 0xff000000;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_0078c510;
  *(undefined8 *)((long)&pTVar5[1].m_name._M_dataplus._M_p + 4) = 0x190a00001909;
  *(undefined8 *)((long)&pTVar5[1].m_name._M_string_length + 4) = 0x4000000006;
  *(undefined4 *)((long)&pTVar5[1].m_name.field_2 + 4) = 0x40;
  tcu::TestNode::addChild(node,pTVar5);
  pTVar5 = (TestNode *)operator_new(0x98);
  pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pTVar3 = (TestContext *)((this->super_TestCaseGroup).m_context)->m_renderCtx;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar5,pTVar2,"format_mismatch_luminance_alpha_luminance_level_0","");
  pTVar5[1]._vptr_TestNode = (_func_int **)pTVar2;
  pTVar5[1].m_testCtx = pTVar3;
  *(undefined4 *)&pTVar5[1].m_name._M_dataplus._M_p = 0xff000000;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_0078c510;
  *(undefined8 *)((long)&pTVar5[1].m_name._M_dataplus._M_p + 4) = 0x19090000190a;
  *(undefined8 *)((long)&pTVar5[1].m_name._M_string_length + 4) = 0x4000000006;
  *(undefined4 *)((long)&pTVar5[1].m_name.field_2 + 4) = 0x40;
  tcu::TestNode::addChild(node,pTVar5);
  pTVar5 = (TestNode *)operator_new(0x98);
  pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pTVar3 = (TestContext *)((this->super_TestCaseGroup).m_context)->m_renderCtx;
  tcu::TestCase::TestCase((TestCase *)pTVar5,pTVar2,"format_mismatch_rgb_rgba_level_0_pos_z","");
  pTVar5[1]._vptr_TestNode = (_func_int **)pTVar2;
  pTVar5[1].m_testCtx = pTVar3;
  *(undefined4 *)&pTVar5[1].m_name._M_dataplus._M_p = 0xff000000;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_0078c510;
  *(undefined8 *)((long)&pTVar5[1].m_name._M_dataplus._M_p + 4) = 0x190800001907;
  *(undefined8 *)((long)&pTVar5[1].m_name._M_string_length + 4) = 0x4000000005;
  *(undefined4 *)((long)&pTVar5[1].m_name.field_2 + 4) = 0x40;
  tcu::TestNode::addChild(node,pTVar5);
  pTVar5 = (TestNode *)operator_new(0x98);
  pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pTVar3 = (TestContext *)((this->super_TestCaseGroup).m_context)->m_renderCtx;
  tcu::TestCase::TestCase((TestCase *)pTVar5,pTVar2,"format_mismatch_rgba_rgb_level_0_neg_z","");
  pTVar5[1]._vptr_TestNode = (_func_int **)pTVar2;
  pTVar5[1].m_testCtx = pTVar3;
  *(undefined4 *)&pTVar5[1].m_name._M_dataplus._M_p = 0xff000000;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_0078c510;
  *(undefined8 *)((long)&pTVar5[1].m_name._M_dataplus._M_p + 4) = 0x190700001908;
  *(undefined8 *)((long)&pTVar5[1].m_name._M_string_length + 4) = 0x4000000004;
  *(undefined4 *)((long)&pTVar5[1].m_name.field_2 + 4) = 0x40;
  tcu::TestNode::addChild(node,pTVar5);
  pTVar5 = (TestNode *)operator_new(0x98);
  pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pTVar3 = (TestContext *)((this->super_TestCaseGroup).m_context)->m_renderCtx;
  tcu::TestCase::TestCase((TestCase *)pTVar5,pTVar2,"missing_level_1","");
  pTVar5[1]._vptr_TestNode = (_func_int **)pTVar2;
  pTVar5[1].m_testCtx = pTVar3;
  *(undefined4 *)&pTVar5[1].m_name._M_dataplus._M_p = 0xff000000;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_0078c550;
  *(undefined8 *)((long)&pTVar5[1].m_name._M_dataplus._M_p + 4) = 0x600000001;
  *(undefined8 *)((long)&pTVar5[1].m_name._M_string_length + 4) = 0x4000000040;
  tcu::TestNode::addChild(node,pTVar5);
  pTVar5 = (TestNode *)operator_new(0x98);
  pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pTVar3 = (TestContext *)((this->super_TestCaseGroup).m_context)->m_renderCtx;
  tcu::TestCase::TestCase((TestCase *)pTVar5,pTVar2,"missing_level_3","");
  pTVar5[1]._vptr_TestNode = (_func_int **)pTVar2;
  pTVar5[1].m_testCtx = pTVar3;
  *(undefined4 *)&pTVar5[1].m_name._M_dataplus._M_p = 0xff000000;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_0078c550;
  *(undefined8 *)((long)&pTVar5[1].m_name._M_dataplus._M_p + 4) = 0x600000003;
  *(undefined8 *)((long)&pTVar5[1].m_name._M_string_length + 4) = 0x4000000040;
  tcu::TestNode::addChild(node,pTVar5);
  pTVar5 = (TestNode *)operator_new(0x98);
  pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pTVar3 = (TestContext *)((this->super_TestCaseGroup).m_context)->m_renderCtx;
  tcu::TestCase::TestCase((TestCase *)pTVar5,pTVar2,"missing_level_1_pos_y","");
  pTVar5[1]._vptr_TestNode = (_func_int **)pTVar2;
  pTVar5[1].m_testCtx = pTVar3;
  *(undefined4 *)&pTVar5[1].m_name._M_dataplus._M_p = 0xff000000;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_0078c550;
  *(undefined8 *)((long)&pTVar5[1].m_name._M_dataplus._M_p + 4) = 0x300000001;
  *(undefined8 *)((long)&pTVar5[1].m_name._M_string_length + 4) = 0x4000000040;
  tcu::TestNode::addChild(node,pTVar5);
  pTVar5 = (TestNode *)operator_new(0x98);
  pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pTVar3 = (TestContext *)((this->super_TestCaseGroup).m_context)->m_renderCtx;
  tcu::TestCase::TestCase((TestCase *)pTVar5,pTVar2,"missing_level_3_neg_y","");
  pTVar5[1]._vptr_TestNode = (_func_int **)pTVar2;
  pTVar5[1].m_testCtx = pTVar3;
  *(undefined4 *)&pTVar5[1].m_name._M_dataplus._M_p = 0xff000000;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_0078c550;
  *(undefined8 *)((long)&pTVar5[1].m_name._M_dataplus._M_p + 4) = 0x200000003;
  *(undefined8 *)((long)&pTVar5[1].m_name._M_string_length + 4) = 0x4000000040;
  tcu::TestNode::addChild(node,pTVar5);
  pTVar5 = (TestNode *)operator_new(0xa0);
  pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pCVar1 = (this->super_TestCaseGroup).m_context;
  pTVar3 = (TestContext *)pCVar1->m_renderCtx;
  pCVar4 = pCVar1->m_contextInfo;
  tcu::TestCase::TestCase((TestCase *)pTVar5,pTVar2,"npot_t_repeat","");
  pTVar5[1]._vptr_TestNode = (_func_int **)pTVar2;
  pTVar5[1].m_testCtx = pTVar3;
  *(undefined4 *)&pTVar5[1].m_name._M_dataplus._M_p = 0xff000000;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_0078c590;
  *(undefined8 *)((long)&pTVar5[1].m_name._M_dataplus._M_p + 4) = 0x29010000812f;
  pTVar5[1].m_name.field_2._M_allocated_capacity = (size_type)pCVar4;
  *(undefined8 *)((long)&pTVar5[1].m_name.field_2 + 8) = 0x7f0000007f;
  tcu::TestNode::addChild(node,pTVar5);
  pTVar5 = (TestNode *)operator_new(0xa0);
  pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pCVar1 = (this->super_TestCaseGroup).m_context;
  pTVar3 = (TestContext *)pCVar1->m_renderCtx;
  pCVar4 = pCVar1->m_contextInfo;
  tcu::TestCase::TestCase((TestCase *)pTVar5,pTVar2,"npot_s_repeat","");
  pTVar5[1]._vptr_TestNode = (_func_int **)pTVar2;
  pTVar5[1].m_testCtx = pTVar3;
  *(undefined4 *)&pTVar5[1].m_name._M_dataplus._M_p = 0xff000000;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_0078c590;
  *(undefined8 *)((long)&pTVar5[1].m_name._M_dataplus._M_p + 4) = 0x812f00002901;
  pTVar5[1].m_name.field_2._M_allocated_capacity = (size_type)pCVar4;
  *(undefined8 *)((long)&pTVar5[1].m_name.field_2 + 8) = 0x7f0000007f;
  tcu::TestNode::addChild(node,pTVar5);
  pTVar5 = (TestNode *)operator_new(0xa0);
  pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pCVar1 = (this->super_TestCaseGroup).m_context;
  pTVar3 = (TestContext *)pCVar1->m_renderCtx;
  pCVar4 = pCVar1->m_contextInfo;
  tcu::TestCase::TestCase((TestCase *)pTVar5,pTVar2,"npot_all_repeat","");
  pTVar5[1]._vptr_TestNode = (_func_int **)pTVar2;
  pTVar5[1].m_testCtx = pTVar3;
  *(undefined4 *)&pTVar5[1].m_name._M_dataplus._M_p = 0xff000000;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_0078c590;
  *(undefined8 *)((long)&pTVar5[1].m_name._M_dataplus._M_p + 4) = 0x290100002901;
  pTVar5[1].m_name.field_2._M_allocated_capacity = (size_type)pCVar4;
  *(undefined8 *)((long)&pTVar5[1].m_name.field_2 + 8) = 0x7f0000007f;
  tcu::TestNode::addChild(node,pTVar5);
  pTVar5 = (TestNode *)operator_new(0xa0);
  pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pCVar1 = (this->super_TestCaseGroup).m_context;
  pTVar3 = (TestContext *)pCVar1->m_renderCtx;
  pCVar4 = pCVar1->m_contextInfo;
  tcu::TestCase::TestCase((TestCase *)pTVar5,pTVar2,"npot_mirrored_repeat","");
  pTVar5[1]._vptr_TestNode = (_func_int **)pTVar2;
  pTVar5[1].m_testCtx = pTVar3;
  *(undefined4 *)&pTVar5[1].m_name._M_dataplus._M_p = 0xff000000;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_0078c590;
  *(undefined8 *)((long)&pTVar5[1].m_name._M_dataplus._M_p + 4) = 0x837000008370;
  pTVar5[1].m_name.field_2._M_allocated_capacity = (size_type)pCVar4;
  *(undefined8 *)((long)&pTVar5[1].m_name.field_2 + 8) = 0x7f0000007f;
  tcu::TestNode::addChild(node,pTVar5);
  pTVar5 = (TestNode *)operator_new(0x90);
  pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pTVar3 = (TestContext *)((this->super_TestCaseGroup).m_context)->m_renderCtx;
  tcu::TestCase::TestCase((TestCase *)pTVar5,pTVar2,"extra_level","");
  pTVar5[1]._vptr_TestNode = (_func_int **)pTVar2;
  pTVar5[1].m_testCtx = pTVar3;
  *(undefined4 *)&pTVar5[1].m_name._M_dataplus._M_p = 0xff000000;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_0078c5d0;
  *(undefined8 *)((long)&pTVar5[1].m_name._M_dataplus._M_p + 4) = 0x4000000040;
  tcu::TestNode::addChild(node,pTVar5);
  pTVar5 = (TestNode *)operator_new(0x90);
  pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pTVar3 = (TestContext *)((this->super_TestCaseGroup).m_context)->m_renderCtx;
  tcu::TestCase::TestCase((TestCase *)pTVar5,pTVar2,"empty_object","");
  pTVar5[1]._vptr_TestNode = (_func_int **)pTVar2;
  pTVar5[1].m_testCtx = pTVar3;
  *(undefined4 *)&pTVar5[1].m_name._M_dataplus._M_p = 0xff000000;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_0078c610;
  *(undefined8 *)((long)&pTVar5[1].m_name._M_dataplus._M_p + 4) = 0x4000000040;
  tcu::TestNode::addChild(node,pTVar5);
  return extraout_EAX;
}

Assistant:

void TextureCompletenessTests::init (void)
{
	tcu::TestCaseGroup* tex2d = new tcu::TestCaseGroup(m_testCtx, "2d", "2D completeness");
	addChild(tex2d);
	tcu::TestCaseGroup* cube = new tcu::TestCaseGroup(m_testCtx, "cube", "Cubemap completeness");
	addChild(cube);

	// Texture 2D size.
	tex2d->addChild(new Incomplete2DSizeCase(m_testCtx, m_context.getRenderContext(), "npot_size",				"", IVec2(255, 255), IVec2(255, 255), 0, m_context.getContextInfo()));
	tex2d->addChild(new Incomplete2DSizeCase(m_testCtx, m_context.getRenderContext(), "npot_size_level_0",		"", IVec2(256, 256), IVec2(255, 255), 0, m_context.getContextInfo()));
	tex2d->addChild(new Incomplete2DSizeCase(m_testCtx, m_context.getRenderContext(), "npot_size_level_1",		"", IVec2(256, 256), IVec2(127, 127), 1, m_context.getContextInfo()));
	tex2d->addChild(new Incomplete2DSizeCase(m_testCtx, m_context.getRenderContext(), "not_positive_level_0",	"", IVec2(256, 256), IVec2(0, 0),	  0, m_context.getContextInfo()));
	// Texture 2D format.
	tex2d->addChild(new Incomplete2DFormatCase(m_testCtx, m_context.getRenderContext(), "format_mismatch_rgb_rgba",						"", IVec2(128, 128), GL_RGB,				GL_RGBA,			1));
	tex2d->addChild(new Incomplete2DFormatCase(m_testCtx, m_context.getRenderContext(), "format_mismatch_rgba_rgb",						"", IVec2(128, 128), GL_RGBA,				GL_RGB,				1));
	tex2d->addChild(new Incomplete2DFormatCase(m_testCtx, m_context.getRenderContext(), "format_mismatch_luminance_luminance_alpha",	"", IVec2(128, 128), GL_LUMINANCE,			GL_LUMINANCE_ALPHA,	1));
	tex2d->addChild(new Incomplete2DFormatCase(m_testCtx, m_context.getRenderContext(), "format_mismatch_luminance_alpha_luminance",	"", IVec2(128, 128), GL_LUMINANCE_ALPHA,	GL_LUMINANCE,		1));
	// Texture 2D missing level.
	tex2d->addChild(new Incomplete2DMissingLevelCase(m_testCtx, m_context.getRenderContext(), "missing_level_1",			"", IVec2(128, 128),	1));
	tex2d->addChild(new Incomplete2DMissingLevelCase(m_testCtx, m_context.getRenderContext(), "missing_level_3",			"", IVec2(128, 128),	3));
	tex2d->addChild(new Incomplete2DMissingLevelCase(m_testCtx, m_context.getRenderContext(), "last_level_missing",			"", IVec2(128, 64),		de::max(deLog2Floor32(128), deLog2Floor32(64))));
	// Texture 2D wrap modes.
	tex2d->addChild(new Incomplete2DWrapModeCase(m_testCtx, m_context.getRenderContext(), "npot_t_repeat",			"", IVec2(127, 127), GL_CLAMP_TO_EDGE,		GL_REPEAT,				m_context.getContextInfo()));
	tex2d->addChild(new Incomplete2DWrapModeCase(m_testCtx, m_context.getRenderContext(), "npot_s_repeat",			"", IVec2(127, 127), GL_REPEAT,				GL_CLAMP_TO_EDGE,		m_context.getContextInfo()));
	tex2d->addChild(new Incomplete2DWrapModeCase(m_testCtx, m_context.getRenderContext(), "npot_all_repeat",		"", IVec2(127, 127), GL_REPEAT,				GL_REPEAT,				m_context.getContextInfo()));
	tex2d->addChild(new Incomplete2DWrapModeCase(m_testCtx, m_context.getRenderContext(), "npot_mirrored_repeat",	"", IVec2(127, 127), GL_MIRRORED_REPEAT,	GL_MIRRORED_REPEAT,		m_context.getContextInfo()));
	tex2d->addChild(new Incomplete2DWrapModeCase(m_testCtx, m_context.getRenderContext(), "repeat_width_npot",		"", IVec2(127, 128), GL_REPEAT,				GL_REPEAT,				m_context.getContextInfo()));
	tex2d->addChild(new Incomplete2DWrapModeCase(m_testCtx, m_context.getRenderContext(), "repeat_height_npot",		"", IVec2(128, 127), GL_REPEAT,				GL_REPEAT,				m_context.getContextInfo()));
	// Texture 2D extra level.
	tex2d->addChild(new Complete2DExtraLevelCase(m_testCtx, m_context.getRenderContext(), "extra_level", "", IVec2(64, 64)));
	// Texture 2D empty object.
	tex2d->addChild(new Incomplete2DEmptyObjectCase(m_testCtx, m_context.getRenderContext(), "empty_object", "", IVec2(64, 64)));

	// Cube size.
	cube->addChild(new IncompleteCubeSizeCase(m_testCtx, m_context.getRenderContext(), "npot_size_level_0",			"", IVec2(64, 64), IVec2(63, 63), 0));
	cube->addChild(new IncompleteCubeSizeCase(m_testCtx, m_context.getRenderContext(), "npot_size_level_1",			"", IVec2(64, 64), IVec2(31, 31), 1));
	cube->addChild(new IncompleteCubeSizeCase(m_testCtx, m_context.getRenderContext(), "npot_size_level_0_pos_x",	"", IVec2(64, 64), IVec2(63, 63), 0, tcu::CUBEFACE_POSITIVE_X));
	cube->addChild(new IncompleteCubeSizeCase(m_testCtx, m_context.getRenderContext(), "npot_size_level_1_neg_x",	"", IVec2(64, 64), IVec2(31, 31), 1, tcu::CUBEFACE_NEGATIVE_X));
	cube->addChild(new IncompleteCubeSizeCase(m_testCtx, m_context.getRenderContext(), "not_positive_level_0",		"", IVec2(64, 64), IVec2(0,0)	, 0));
	// Cube format.
	cube->addChild(new IncompleteCubeFormatCase(m_testCtx, m_context.getRenderContext(), "format_mismatch_rgb_rgba_level_0",					"", IVec2(64, 64), GL_RGB,				GL_RGBA));
	cube->addChild(new IncompleteCubeFormatCase(m_testCtx, m_context.getRenderContext(), "format_mismatch_rgba_rgb_level_0",					"", IVec2(64, 64), GL_RGBA,				GL_RGB));
	cube->addChild(new IncompleteCubeFormatCase(m_testCtx, m_context.getRenderContext(), "format_mismatch_luminance_luminance_alpha_level_0",	"", IVec2(64, 64), GL_LUMINANCE,		GL_LUMINANCE_ALPHA));
	cube->addChild(new IncompleteCubeFormatCase(m_testCtx, m_context.getRenderContext(), "format_mismatch_luminance_alpha_luminance_level_0",	"", IVec2(64, 64), GL_LUMINANCE_ALPHA,	GL_LUMINANCE));
	cube->addChild(new IncompleteCubeFormatCase(m_testCtx, m_context.getRenderContext(), "format_mismatch_rgb_rgba_level_0_pos_z",				"", IVec2(64, 64), GL_RGB,				GL_RGBA,	tcu::CUBEFACE_POSITIVE_Z));
	cube->addChild(new IncompleteCubeFormatCase(m_testCtx, m_context.getRenderContext(), "format_mismatch_rgba_rgb_level_0_neg_z",				"", IVec2(64, 64), GL_RGBA,				GL_RGB,		tcu::CUBEFACE_NEGATIVE_Z));
	// Cube missing level.
	cube->addChild(new IncompleteCubeMissingLevelCase(m_testCtx, m_context.getRenderContext(), "missing_level_1",		"", IVec2(64, 64), 1));
	cube->addChild(new IncompleteCubeMissingLevelCase(m_testCtx, m_context.getRenderContext(), "missing_level_3",		"", IVec2(64, 64), 3));
	cube->addChild(new IncompleteCubeMissingLevelCase(m_testCtx, m_context.getRenderContext(), "missing_level_1_pos_y",	"", IVec2(64, 64), 1, tcu::CUBEFACE_POSITIVE_Y));
	cube->addChild(new IncompleteCubeMissingLevelCase(m_testCtx, m_context.getRenderContext(), "missing_level_3_neg_y",	"", IVec2(64, 64), 3, tcu::CUBEFACE_NEGATIVE_Y));
	// Cube wrap modes.
	cube->addChild(new IncompleteCubeWrapModeCase(m_testCtx, m_context.getRenderContext(), "npot_t_repeat",			"", IVec2(127, 127), GL_CLAMP_TO_EDGE,		GL_REPEAT,				m_context.getContextInfo()));
	cube->addChild(new IncompleteCubeWrapModeCase(m_testCtx, m_context.getRenderContext(), "npot_s_repeat",			"", IVec2(127, 127), GL_REPEAT,				GL_CLAMP_TO_EDGE,		m_context.getContextInfo()));
	cube->addChild(new IncompleteCubeWrapModeCase(m_testCtx, m_context.getRenderContext(), "npot_all_repeat",		"", IVec2(127, 127), GL_REPEAT,				GL_REPEAT,				m_context.getContextInfo()));
	cube->addChild(new IncompleteCubeWrapModeCase(m_testCtx, m_context.getRenderContext(), "npot_mirrored_repeat",	"", IVec2(127, 127), GL_MIRRORED_REPEAT,	GL_MIRRORED_REPEAT,		m_context.getContextInfo()));
	// Cube extra level.
	cube->addChild(new CompleteCubeExtraLevelCase(m_testCtx, m_context.getRenderContext(), "extra_level", "", IVec2(64, 64)));
	// Cube extra level.
	cube->addChild(new IncompleteCubeEmptyObjectCase(m_testCtx, m_context.getRenderContext(), "empty_object", "", IVec2(64, 64)));
}